

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O1

void write_character_dump(ang_file *fff)

{
  byte bVar1;
  store_conflict *psVar2;
  object **list;
  char cVar3;
  uint16_t uVar4;
  ushort uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  object *poVar10;
  size_t sVar11;
  wchar_t wVar12;
  int opt;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  wchar_t c;
  wchar_t a;
  char o_name [80];
  wchar_t local_b4;
  char *local_b0;
  int local_a4;
  object **local_a0;
  store_conflict *local_98;
  store_conflict *local_90;
  char local_88 [88];
  
  psVar2 = stores;
  bVar1 = f_info[0xe].shopnum;
  local_a0 = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  if ((cached_config == (char_sheet_config *)0x0) ||
     (cached_config->res_cols != cached_config->res_nlabel + (uint)(player->body).count + L'\x01'))
  {
    configure_char_sheet();
  }
  local_90 = psVar2 + bVar1;
  local_98 = psVar2 + ((ulong)bVar1 - 1);
  iVar16 = 0x50;
  if (L'\'' < cached_config->res_cols) {
    iVar16 = cached_config->res_cols * 2 + 1;
  }
  wVar6 = text_wcsz();
  pcVar9 = (char *)mem_alloc((long)(wVar6 * iVar16 + 1));
  file_putf(fff,"  [%s Character Dump]\n\n",buildid);
  display_player(L'\0');
  wVar6 = L'\x01';
  local_b0 = pcVar9;
  do {
    wVar12 = L'\0';
    pcVar17 = pcVar9;
    do {
      Term_what(wVar12,wVar6,&local_a4,&local_b4);
      wVar7 = text_wctomb(pcVar17,local_b4);
      pcVar9 = local_b0;
      if (wVar7 < L'\x01') {
        *pcVar17 = ' ';
        pcVar17 = pcVar17 + 1;
      }
      else {
        pcVar17 = pcVar17 + (uint)wVar7;
      }
      wVar12 = wVar12 + L'\x01';
    } while (wVar12 != L'O');
    do {
      pcVar18 = pcVar17;
      if (pcVar18 <= local_b0) break;
      pcVar17 = pcVar18 + -1;
    } while (pcVar18[-1] == ' ');
    *pcVar18 = '\0';
    file_putf(fff,"%s\n",local_b0);
    wVar6 = wVar6 + L'\x01';
  } while (wVar6 != L'\x17');
  display_player(L'\x01');
  file_putf(fff,"%-20s%s\n","Resistances","Abilities");
  iVar16 = cached_config->res_regions[0].row;
  wVar6 = cached_config->n_resist_by_region[1];
  if (cached_config->n_resist_by_region[1] < cached_config->n_resist_by_region[0]) {
    wVar6 = cached_config->n_resist_by_region[0];
  }
  wVar6 = iVar16 + wVar6 + L'\x02';
  wVar12 = iVar16 + L'\x02';
  if (wVar12 < wVar6) {
    do {
      pcVar17 = pcVar9;
      if (L'\xffffffff' < cached_config->res_cols) {
        wVar7 = L'\xffffffff';
        pcVar17 = local_b0;
        do {
          wVar7 = wVar7 + L'\x01';
          Term_what(wVar7,wVar12,&local_a4,&local_b4);
          wVar8 = text_wctomb(pcVar17,local_b4);
          if (wVar8 < L'\x01') {
            *pcVar17 = ' ';
            pcVar17 = pcVar17 + 1;
          }
          else {
            pcVar17 = pcVar17 + (uint)wVar8;
          }
        } while (wVar7 < cached_config->res_cols * 2);
      }
      do {
        pcVar18 = pcVar17;
        pcVar9 = local_b0;
        if (pcVar18 <= local_b0) break;
        pcVar17 = pcVar18 + -1;
      } while (pcVar18[-1] == ' ');
      *pcVar18 = '\0';
      file_putf(fff,"%s\n",local_b0);
      wVar12 = wVar12 + L'\x01';
    } while (wVar12 != wVar6);
  }
  file_putf(fff,"\n");
  file_putf(fff,"%-20s%s\n","Hindrances","Modifiers");
  iVar16 = cached_config->res_regions[0].row;
  wVar6 = cached_config->n_resist_by_region[3];
  if (cached_config->n_resist_by_region[3] < cached_config->n_resist_by_region[2]) {
    wVar6 = cached_config->n_resist_by_region[2];
  }
  wVar6 = iVar16 + wVar6 + L'\x02';
  wVar12 = iVar16 + L'\x02';
  if (wVar12 < wVar6) {
    do {
      pcVar17 = pcVar9;
      if (L'\xffffffff' < cached_config->res_cols) {
        iVar16 = cached_config->res_cols * 2;
        iVar15 = -1;
        pcVar17 = local_b0;
        do {
          Term_what(iVar16 + iVar15 + L'\x03',wVar12,&local_a4,&local_b4);
          wVar7 = text_wctomb(pcVar17,local_b4);
          if (wVar7 < L'\x01') {
            *pcVar17 = ' ';
            pcVar17 = pcVar17 + 1;
          }
          else {
            pcVar17 = pcVar17 + (uint)wVar7;
          }
          iVar16 = cached_config->res_cols * 2;
          iVar15 = iVar15 + 1;
        } while (iVar15 < iVar16);
      }
      do {
        pcVar18 = pcVar17;
        pcVar9 = local_b0;
        if (pcVar18 <= local_b0) break;
        pcVar17 = pcVar18 + -1;
      } while (pcVar18[-1] == ' ');
      *pcVar18 = '\0';
      file_putf(fff,"%s\n",local_b0);
      wVar12 = wVar12 + L'\x01';
    } while (wVar12 != wVar6);
  }
  file_putf(fff,"\n\n");
  if (player->is_dead == true) {
    uVar4 = messages_num();
    file_putf(fff,"  [Last Messages]\n\n");
    if (uVar4 != 0) {
      uVar5 = 0xf;
      if (uVar4 < 0xf) {
        uVar5 = uVar4;
      }
      iVar16 = uVar5 + 1;
      do {
        pcVar9 = message_str((short)iVar16 - 2);
        file_putf(fff,"> %s\n",pcVar9);
        iVar16 = iVar16 + -1;
      } while (1 < iVar16);
    }
    pcVar9 = player->died_from;
    iVar16 = strcmp(pcVar9,"Retiring");
    if (iVar16 == 0) {
      file_putf(fff,"\nRetired.\n\n");
    }
    else {
      file_putf(fff,"\nKilled by %s.\n\n",pcVar9);
    }
  }
  file_putf(fff,"  [Character Equipment]\n\n");
  if ((player->body).count != 0) {
    wVar6 = L'\0';
    do {
      poVar10 = slot_object(player,wVar6);
      if (poVar10 != (object *)0x0) {
        object_desc(local_88,0x50,poVar10,0x43,player);
        cVar3 = gear_to_label(player,poVar10);
        file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
        object_info_chardump(fff,poVar10,L'\x05',L'H');
      }
      wVar6 = wVar6 + L'\x01';
    } while ((uint)wVar6 < (uint)(player->body).count);
  }
  file_putf(fff,"\n\n");
  file_putf(fff,"\n\n  [Character Inventory]\n\n");
  if (z_info->pack_size != 0) {
    uVar13 = 0;
    do {
      poVar10 = player->upkeep->inven[uVar13];
      if (poVar10 == (object *)0x0) break;
      object_desc(local_88,0x50,poVar10,0x43,player);
      cVar3 = gear_to_label(player,poVar10);
      file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
      object_info_chardump(fff,poVar10,L'\x05',L'H');
      uVar13 = uVar13 + 1;
    } while (uVar13 < z_info->pack_size);
  }
  file_putf(fff,"\n\n");
  file_putf(fff,"\n\n  [Character Quiver]\n\n");
  list = local_a0;
  if (z_info->quiver_size != 0) {
    uVar13 = 0;
    do {
      poVar10 = player->upkeep->quiver[uVar13];
      if (poVar10 != (object *)0x0) {
        object_desc(local_88,0x50,poVar10,0x43,player);
        cVar3 = gear_to_label(player,poVar10);
        file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
        object_info_chardump(fff,poVar10,L'\x05',L'H');
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < z_info->quiver_size);
  }
  file_putf(fff,"\n\n");
  store_stock_list(local_98,list,(uint)z_info->store_inven_max);
  if (local_90[-1].stock_num != '\0') {
    file_putf(fff,"  [Home Inventory]\n\n");
    if (z_info->store_inven_max != 0) {
      uVar13 = 0;
      do {
        poVar10 = list[uVar13];
        if (poVar10 == (object *)0x0) break;
        object_desc(local_88,0x50,poVar10,0x43,player);
        file_putf(fff,"%c) %s\n",(ulong)((int)uVar13 + 0x61),local_88);
        object_info_chardump(fff,poVar10,L'\x05',L'H');
        uVar13 = uVar13 + 1;
      } while (uVar13 < z_info->store_inven_max);
    }
    file_putf(fff,"\n\n");
  }
  dump_history(fff);
  file_putf(fff,"\n\n");
  file_putf(fff,"  [Options]\n\n");
  iVar16 = 0;
  do {
    pcVar9 = "User interface";
    if (iVar16 == 0) {
LAB_001e5fc9:
      file_putf(fff,"  [%s]\n\n",pcVar9);
      lVar14 = 0;
      do {
        opt = (int)lVar14;
        iVar15 = option_type(opt);
        if (iVar15 == iVar16) {
          pcVar9 = option_desc(opt);
          sVar11 = utf8_strlen(pcVar9);
          if (sVar11 < 0x2d) {
            file_putf(fff,"%s%*s",pcVar9,(ulong)(0x2d - (int)sVar11)," ");
          }
          else {
            file_putf(fff,"%s",pcVar9);
          }
          pcVar9 = "no ";
          if ((player->opts).opt[lVar14] != false) {
            pcVar9 = "yes";
          }
          pcVar17 = option_name(opt);
          file_putf(fff,": %s (%s)\n",pcVar9,pcVar17);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x2d);
      file_putf(fff,"\n");
    }
    else if (iVar16 == 1) {
      pcVar9 = "Birth";
      goto LAB_001e5fc9;
    }
    iVar16 = iVar16 + 1;
    if (iVar16 == 5) {
      if ((player->opts).opt[0x1e] == true) {
        file_putf(fff,"  [Randart seed]\n\n");
        file_putf(fff,"%08lx\n\n",(ulong)seed_randart);
      }
      mem_free(local_a0);
      mem_free(local_b0);
      return;
    }
  } while( true );
}

Assistant:

void write_character_dump(ang_file *fff)
{
	int i, x, y, ylim;

	int a;
	wchar_t c;

	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object **home_list = mem_zalloc(sizeof(struct object *) *
										   z_info->store_inven_max);
	char o_name[80];

	int n;
	char *buf, *p;

	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	n = 80;
	if (n < 2 * cached_config->res_cols + 1) {
		n = 2 * cached_config->res_cols + 1;
	}
	buf = mem_alloc(text_wcsz() * n + 1);

	/* Begin dump */
	file_putf(fff, "  [%s Character Dump]\n\n", buildid);

	/* Display player basics */
	display_player(0);

	/* Dump part of the screen */
	for (y = 1; y < 23; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 79; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Display player resistances etc */
	display_player(1);

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Resistances", "Abilities");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[0] >
		cached_config->n_resist_by_region[1]) ?
		cached_config->n_resist_by_region[0] :
		cached_config->n_resist_by_region[1]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip a line */
	file_putf(fff, "\n");

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Hindrances", "Modifiers");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[2] >
		cached_config->n_resist_by_region[3]) ?
		cached_config->n_resist_by_region[2] :
		cached_config->n_resist_by_region[3]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x + 2 * cached_config->res_cols + 2, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip some lines */
	file_putf(fff, "\n\n");


	/* If dead, dump last messages -- Prfnoff */
	if (player->is_dead) {
		i = messages_num();
		if (i > 15) i = 15;
		file_putf(fff, "  [Last Messages]\n\n");
		while (i-- > 0)
		{
			file_putf(fff, "> %s\n", message_str((int16_t)i));
		}
		if (streq(player->died_from, "Retiring")) {
			file_putf(fff, "\nRetired.\n\n");
		} else {
			file_putf(fff, "\nKilled by %s.\n\n",
				player->died_from);
		}
	}


	/* Dump the equipment */
	file_putf(fff, "  [Character Equipment]\n\n");
	for (i = 0; i < player->body.count; i++) {
		struct object *obj = slot_object(player, i);
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the inventory */
	file_putf(fff, "\n\n  [Character Inventory]\n\n");
	for (i = 0; i < z_info->pack_size; i++) {
		struct object *obj = player->upkeep->inven[i];
		if (!obj) break;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the quiver */
	file_putf(fff, "\n\n  [Character Quiver]\n\n");
	for (i = 0; i < z_info->quiver_size; i++) {
		struct object *obj = player->upkeep->quiver[i];
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the Home -- if anything there */
	store_stock_list(home, home_list, z_info->store_inven_max);
	if (home->stock_num) {
		/* Header */
		file_putf(fff, "  [Home Inventory]\n\n");

		/* Dump all available items */
		for (i = 0; i < z_info->store_inven_max; i++) {
			struct object *obj = home_list[i];
			if (!obj) break;
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
			file_putf(fff, "%c) %s\n", I2A(i), o_name);

			object_info_chardump(fff, obj, 5, 72);
		}

		/* Add an empty line */
		file_putf(fff, "\n\n");
	}

	/* Dump character history */
	dump_history(fff);
	file_putf(fff, "\n\n");

	/* Dump options */
	file_putf(fff, "  [Options]\n\n");

	/* Dump options */
	for (i = 0; i < OP_MAX; i++) {
		int opt;
		const char *title = "";
		switch (i) {
			case OP_INTERFACE: title = "User interface"; break;
			case OP_BIRTH: title = "Birth"; break;
		    default: continue;
		}

		file_putf(fff, "  [%s]\n\n", title);
		for (opt = 0; opt < OPT_MAX; opt++) {
			const char *desc;
			size_t u8len;

			if (option_type(opt) != i) continue;
			desc = option_desc(opt);
			u8len = utf8_strlen(desc);
			if (u8len < 45) {
				file_putf(fff, "%s%*s", desc,
					(int)(45 - u8len), " ");
			} else {
				file_putf(fff, "%s", desc);
			}
			file_putf(fff, ": %s (%s)\n",
			        player->opts.opt[opt] ? "yes" : "no ",
			        option_name(opt));
		}

		/* Skip some lines */
		file_putf(fff, "\n");
	}

	/*
	 * Display the randart seed, if applicable.  Use the same format as is
	 * used when constructing the randart file name.
	 */
	if (OPT(player, birth_randarts)) {
		file_putf(fff, "  [Randart seed]\n\n");
		file_putf(fff, "%08lx\n\n", (unsigned long)seed_randart);
	}

	mem_free(home_list);
	mem_free(buf);
}